

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

uint64_t SharpYUVUpdateY_SSE2(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  short sVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  short sVar18;
  ushort uVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  short sVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  short sVar28;
  ushort uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  auVar3 = _DAT_00155b10;
  if (len < 8) {
    uVar6 = 0;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    iVar13 = 0;
  }
  else {
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    iVar13 = 0;
    uVar5 = 0;
    do {
      puVar1 = ref + uVar5;
      puVar2 = src + uVar5;
      auVar31._0_2_ = *puVar1 - *puVar2;
      auVar31._2_2_ = puVar1[1] - puVar2[1];
      auVar31._4_2_ = puVar1[2] - puVar2[2];
      auVar31._6_2_ = puVar1[3] - puVar2[3];
      auVar31._8_2_ = puVar1[4] - puVar2[4];
      auVar31._10_2_ = puVar1[5] - puVar2[5];
      auVar31._12_2_ = puVar1[6] - puVar2[6];
      auVar31._14_2_ = puVar1[7] - puVar2[7];
      puVar1 = dst + uVar5;
      auVar30 = psraw(auVar31,0xf);
      sVar14 = *puVar1 + auVar31._0_2_;
      sVar16 = puVar1[1] + auVar31._2_2_;
      sVar18 = puVar1[2] + auVar31._4_2_;
      sVar20 = puVar1[3] + auVar31._6_2_;
      sVar22 = puVar1[4] + auVar31._8_2_;
      sVar24 = puVar1[5] + auVar31._10_2_;
      sVar26 = puVar1[6] + auVar31._12_2_;
      sVar28 = puVar1[7] + auVar31._14_2_;
      uVar15 = (ushort)(0x3ff < sVar14) * 0x3ff | (ushort)(0x3ff >= sVar14) * sVar14;
      uVar17 = (ushort)(0x3ff < sVar16) * 0x3ff | (ushort)(0x3ff >= sVar16) * sVar16;
      uVar19 = (ushort)(0x3ff < sVar18) * 0x3ff | (ushort)(0x3ff >= sVar18) * sVar18;
      uVar21 = (ushort)(0x3ff < sVar20) * 0x3ff | (ushort)(0x3ff >= sVar20) * sVar20;
      uVar23 = (ushort)(0x3ff < sVar22) * 0x3ff | (ushort)(0x3ff >= sVar22) * sVar22;
      uVar25 = (ushort)(0x3ff < sVar24) * 0x3ff | (ushort)(0x3ff >= sVar24) * sVar24;
      uVar27 = (ushort)(0x3ff < sVar26) * 0x3ff | (ushort)(0x3ff >= sVar26) * sVar26;
      uVar29 = (ushort)(0x3ff < sVar28) * 0x3ff | (ushort)(0x3ff >= sVar28) * sVar28;
      auVar31 = pmaddwd(auVar30 | auVar3,auVar31);
      iVar10 = iVar10 + auVar31._0_4_;
      iVar11 = iVar11 + auVar31._4_4_;
      iVar12 = iVar12 + auVar31._8_4_;
      iVar13 = iVar13 + auVar31._12_4_;
      puVar1 = dst + uVar5;
      *puVar1 = (-1 < (short)uVar15) * uVar15;
      puVar1[1] = (-1 < (short)uVar17) * uVar17;
      puVar1[2] = (-1 < (short)uVar19) * uVar19;
      puVar1[3] = (-1 < (short)uVar21) * uVar21;
      puVar1[4] = (-1 < (short)uVar23) * uVar23;
      puVar1[5] = (-1 < (short)uVar25) * uVar25;
      puVar1[6] = (-1 < (short)uVar27) * uVar27;
      puVar1[7] = (-1 < (short)uVar29) * uVar29;
      uVar6 = uVar5 + 8;
      uVar4 = uVar5 + 0x10;
      uVar5 = uVar6;
    } while (uVar4 <= (uint)len);
  }
  uVar5 = (ulong)(uint)(iVar13 + iVar11 + iVar12 + iVar10);
  if ((int)uVar6 < len) {
    uVar6 = uVar6 & 0xffffffff;
    do {
      iVar10 = (uint)ref[uVar6] - (uint)src[uVar6];
      uVar7 = (uint)dst[uVar6] + iVar10;
      uVar9 = 0x3ff;
      if (uVar7 < 0x3ff) {
        uVar9 = uVar7;
      }
      uVar8 = (uint16_t)uVar9;
      if ((int)uVar7 < 0) {
        uVar8 = 0;
      }
      dst[uVar6] = uVar8;
      uVar15 = -(ushort)iVar10;
      if (0 < iVar10) {
        uVar15 = (ushort)iVar10;
      }
      uVar5 = uVar5 + uVar15;
      uVar6 = uVar6 + 1;
    } while ((uint)len != uVar6);
  }
  return uVar5;
}

Assistant:

static uint64_t SharpYUVUpdateY_SSE2(const uint16_t* ref, const uint16_t* src,
                                     uint16_t* dst, int len) {
  uint64_t diff = 0;
  uint32_t tmp[4];
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i max = _mm_set1_epi16(MAX_Y);
  const __m128i one = _mm_set1_epi16(1);
  __m128i sum = zero;

  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);       // diff_y
    const __m128i E = _mm_cmpgt_epi16(zero, D);  // sign (-1 or 0)
    const __m128i F = _mm_add_epi16(C, D);       // new_y
    const __m128i G = _mm_or_si128(E, one);      // -1 or 1
    const __m128i H = _mm_max_epi16(_mm_min_epi16(F, max), zero);
    const __m128i I = _mm_madd_epi16(D, G);      // sum(abs(...))
    _mm_storeu_si128((__m128i*)(dst + i), H);
    sum = _mm_add_epi32(sum, I);
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  diff = tmp[3] + tmp[2] + tmp[1] + tmp[0];
  for (; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}